

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O0

void __thiscall
AI::HierarchicalTaskNetworkComponent::tickEmotionalState
          (HierarchicalTaskNetworkComponent *this,float dt)

{
  ValueOverTimeTracker *this_00;
  bool bVar1;
  mapped_type_conflict *pmVar2;
  float fVar3;
  key_type local_58;
  key_type local_54;
  ValueOverTimeTracker *local_50;
  mapped_type *curiosityTracker;
  ValueOverTimeTracker *local_40;
  mapped_type *alertnessTracker;
  mapped_type_conflict *local_30;
  mapped_type_conflict *boredom;
  float *local_20;
  mapped_type_conflict *alertness;
  HierarchicalTaskNetworkComponent *pHStack_10;
  float dt_local;
  HierarchicalTaskNetworkComponent *this_local;
  
  boredom._4_4_ = 0;
  alertness._4_4_ = dt;
  pHStack_10 = this;
  local_20 = std::
             map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
             ::operator[](&(this->state).current.values,(key_type *)((long)&boredom + 4));
  fVar3 = Math::clamp(*local_20 - 0.09,0.0,100.0);
  *local_20 = fVar3;
  alertnessTracker._4_4_ = 1;
  local_30 = std::
             map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
             ::operator[](&(this->state).current.values,(key_type *)((long)&alertnessTracker + 4));
  fVar3 = Math::clamp(*local_30 + 0.01,0.0,100.0);
  *local_30 = fVar3;
  curiosityTracker._4_4_ = 0;
  local_40 = std::
             map<WorldStateIdentifier,_ValueOverTimeTracker,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_ValueOverTimeTracker>_>_>
             ::operator[](&(this->state).valueTrackers,(key_type *)((long)&curiosityTracker + 4));
  local_54 = Curiosity;
  local_50 = std::
             map<WorldStateIdentifier,_ValueOverTimeTracker,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_ValueOverTimeTracker>_>_>
             ::operator[](&(this->state).valueTrackers,&local_54);
  ValueOverTimeTracker::update(local_40,*local_20,alertness._4_4_);
  this_00 = local_50;
  local_58 = Curiosity;
  pmVar2 = std::
           map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
           ::operator[](&(this->state).current.values,&local_58);
  ValueOverTimeTracker::update(this_00,*pmVar2,alertness._4_4_);
  bVar1 = std::function<bool_(ValueOverTimeTracker_&)>::operator()
                    (&local_40->durationExceedsExtension,local_40);
  if ((bVar1) &&
     (bVar1 = std::function<bool_(ValueOverTimeTracker_&)>::operator()
                        (&local_50->durationExceedsExtension,local_50), bVar1)) {
    WorldState::produceFactFlag(&this->state,LostLead,true);
  }
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::tickEmotionalState(float dt)
{
	auto& alertness = state.current.values[WorldStateIdentifier::Alertness];
	alertness = clamp(alertness - 0.09f, 0.f, 100.f);

	auto& boredom = state.current.values[WorldStateIdentifier::Boredom];
	boredom = clamp(boredom + 0.01f, 0.f, 100.f);

	auto& alertnessTracker = state.valueTrackers[WorldStateIdentifier::Alertness];
	auto& curiosityTracker = state.valueTrackers[WorldStateIdentifier::Curiosity];
	
	alertnessTracker.update(alertness, dt);
	curiosityTracker.update(state.current.values[WorldStateIdentifier::Curiosity], dt);
	
	if (alertnessTracker.durationExceedsExtension(alertnessTracker)
		&& curiosityTracker.durationExceedsExtension(curiosityTracker))
	{
		state.produceFactFlag(ConsumableFact::LostLead, true);
	}
	
	return;
}